

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PlotEx(ImGuiPlotType plot_type,char *label,_func_float_void_ptr_int *values_getter,
                  void *data,int values_count,int values_offset,char *overlay_text,float scale_min,
                  float scale_max,ImVec2 graph_size)

{
  ImVec4 *pIVar1;
  ImDrawList *this;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ImGuiContext *pIVar8;
  _func_float_void_ptr_int *p_Var9;
  bool bVar10;
  ImU32 IVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  ImU32 IVar16;
  void *pvVar17;
  float fVar18;
  uint in_XMM0_Db;
  ImVec2 IVar19;
  ImVec2 IVar20;
  undefined4 uVar21;
  uint in_XMM0_Dc;
  undefined4 uVar22;
  uint in_XMM0_Dd;
  undefined4 uVar23;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  float fVar24;
  float fVar25;
  ImVec2 pos1;
  ImRect frame_bb;
  ImVec2 pos0;
  ImRect inner_bb;
  ImRect total_bb;
  ImVec2 local_150;
  undefined1 local_148 [8];
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [16];
  void *local_128;
  ulong local_120;
  ImU32 local_114;
  ImVec2 local_110;
  ImVec2 local_108;
  _func_float_void_ptr_int *local_100;
  ImVec4 local_f8;
  ImRect local_e8;
  ImGuiWindow *local_d8;
  float local_cc;
  float local_c8;
  float local_c4;
  float local_c0;
  float local_bc;
  float local_b8;
  float local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  ulong local_90;
  float local_88;
  float fStack_84;
  ImGuiContext *local_78;
  char *local_70;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  ImRect local_40;
  
  pIVar8 = GImGui;
  local_d8 = GImGui->CurrentWindow;
  local_d8->Accessed = true;
  if (local_d8->SkipItems == false) {
    uVar14 = (ulong)(uint)values_offset;
    uStack_140 = in_XMM2_Dc;
    local_148 = (undefined1  [8])graph_size;
    uStack_13c = in_XMM2_Dd;
    local_128 = data;
    local_b8 = scale_max;
    local_a8 = scale_min;
    uStack_a4 = in_XMM0_Db;
    uStack_a0 = in_XMM0_Dc;
    uStack_9c = in_XMM0_Dd;
    IVar19 = CalcTextSize(label,(char *)0x0,true,-1.0);
    local_88 = IVar19.x;
    fStack_84 = IVar19.y;
    if (((float)local_148._0_4_ == 0.0) && (!NAN((float)local_148._0_4_))) {
      fVar18 = (GImGui->CurrentWindow->DC).ItemWidth;
      if (fVar18 < 0.0) {
        local_138 = ZEXT416((uint)fVar18);
        IVar20 = GetContentRegionAvail();
        IVar19.y = fStack_84;
        IVar19.x = local_88;
        fVar24 = (float)local_138._0_4_ + IVar20.x;
        fVar18 = 1.0;
        if (1.0 <= fVar24) {
          fVar18 = fVar24;
        }
      }
      local_148._0_4_ = (undefined4)(int)fVar18;
    }
    if (((float)local_148._4_4_ == 0.0) && (!NAN((float)local_148._4_4_))) {
      fVar18 = (pIVar8->Style).FramePadding.y;
      local_148._4_4_ = fVar18 + fVar18 + IVar19.y;
    }
    local_108.x = (local_d8->DC).CursorPos.x + (float)local_148._0_4_;
    fVar18 = (float)local_148._4_4_ + (local_d8->DC).CursorPos.y;
    local_108.y = fVar18;
    local_110 = (local_d8->DC).CursorPos;
    local_e8.Max.x = (pIVar8->Style).FramePadding.x;
    local_e8.Max.y = (pIVar8->Style).FramePadding.y;
    local_e8.Min.x = local_110.x + local_e8.Max.x;
    local_cc = local_110.y;
    local_e8.Min.y = local_110.y + local_e8.Max.y;
    local_e8.Max.x = local_108.x - local_e8.Max.x;
    local_e8.Max.y = fVar18 - local_e8.Max.y;
    fVar24 = 0.0;
    if (0.0 < IVar19.x) {
      fVar24 = (pIVar8->Style).ItemInnerSpacing.x + local_88;
    }
    local_40.Max.x = local_108.x + fVar24;
    local_40.Max.y = fVar18 + 0.0;
    local_f8.x = local_40.Max.x - local_110.x;
    local_f8.y = (fVar18 + 0.0) - local_110.y;
    local_40.Min = local_110;
    ItemSize((ImVec2 *)&local_f8,(pIVar8->Style).FramePadding.y);
    bVar10 = ItemAdd(&local_40,(ImGuiID *)0x0);
    pvVar17 = local_128;
    if (bVar10) {
      local_120 = uVar14;
      local_100 = values_getter;
      local_70 = label;
      if (((local_a8 == 3.4028235e+38) && (!NAN(local_a8))) ||
         ((local_b8 == 3.4028235e+38 && (!NAN(local_b8))))) {
        if (values_count < 1) {
          fVar18 = -3.4028235e+38;
          local_138._0_4_ = 3.4028235e+38;
          local_138._4_4_ = 0;
          local_138._8_4_ = 0;
          local_138._12_4_ = 0;
        }
        else {
          iVar12 = 0;
          fVar18 = -3.4028235e+38;
          local_138._0_4_ = 3.4028235e+38;
          local_138._4_4_ = 0;
          local_138._8_4_ = 0;
          local_138._12_4_ = 0;
          do {
            fVar24 = (*values_getter)(pvVar17,iVar12);
            if (fVar24 <= (float)local_138._0_4_) {
              local_138._0_4_ = fVar24;
            }
            fVar18 = (float)(-(uint)(fVar24 <= fVar18) & (uint)fVar18 |
                            ~-(uint)(fVar24 <= fVar18) & (uint)fVar24);
            iVar12 = iVar12 + 1;
          } while (values_count != iVar12);
        }
        uStack_a4 = local_138._4_4_ & uStack_a4;
        uStack_a0 = local_138._8_4_ & uStack_a0;
        uStack_9c = local_138._12_4_ & uStack_9c;
        local_a8 = (float)(~-(uint)(local_a8 == 3.4028235e+38) & (uint)local_a8 |
                          local_138._0_4_ & -(uint)(local_a8 == 3.4028235e+38));
        local_b8 = (float)(~-(uint)(local_b8 == 3.4028235e+38) & (uint)local_b8 |
                          (uint)fVar18 & -(uint)(local_b8 == 3.4028235e+38));
        values_offset = (int)local_120;
      }
      IVar19 = local_108;
      local_138._8_8_ = 0;
      local_138._0_4_ = local_110.x;
      local_138._4_4_ = local_110.y;
      local_f8.x = (GImGui->Style).Colors[7].x;
      local_f8.y = (GImGui->Style).Colors[7].y;
      uVar2 = (GImGui->Style).Colors[7].z;
      uVar3 = (GImGui->Style).Colors[7].w;
      local_f8.w = (GImGui->Style).Alpha * (float)uVar3;
      local_f8.z = (float)uVar2;
      IVar11 = ColorConvertFloat4ToU32(&local_f8);
      RenderFrame((ImVec2)local_138._0_8_,IVar19,IVar11,true,(pIVar8->Style).FrameRounding);
      iVar12 = (int)(float)local_148._0_4_;
      if (values_count <= (int)(float)local_148._0_4_) {
        iVar12 = values_count;
      }
      local_138._0_4_ = values_count - (uint)(plot_type == ImGuiPlotType_Lines);
      bVar10 = IsHovered(&local_e8,0,false);
      p_Var9 = local_100;
      uVar14 = 0xffffffff;
      if (bVar10) {
        fVar24 = ((pIVar8->IO).MousePos.x - local_e8.Min.x) / (local_e8.Max.x - local_e8.Min.x);
        fVar18 = 0.9999;
        if (fVar24 <= 0.9999) {
          fVar18 = fVar24;
        }
        uVar13 = (uint)((float)(int)local_138._0_4_ * (float)(~-(uint)(fVar24 < 0.0) & (uint)fVar18)
                       );
        uVar14 = (ulong)uVar13;
        if (((int)uVar13 < 0) || (values_count <= (int)uVar13)) {
          __assert_fail("v_idx >= 0 && v_idx < values_count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                        ,0x1bb1,
                        "void ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                       );
        }
        fVar18 = (*local_100)(local_128,(int)(uVar13 + values_offset) % values_count);
        local_148._0_4_ = fVar18;
        (*p_Var9)(local_128,(int)(uVar13 + values_offset + 1) % values_count);
        if (plot_type == ImGuiPlotType_Lines) {
          SetTooltip("%d: %8.4g\n%d: %8.4g",(ulong)uVar13,(ulong)(uVar13 + 1));
        }
        else if (plot_type == ImGuiPlotType_Histogram) {
          SetTooltip("%d: %8.4g",(double)(float)local_148._0_4_,(ulong)uVar13);
        }
      }
      pvVar17 = local_128;
      local_78 = pIVar8;
      iVar12 = iVar12 - (uint)(plot_type == ImGuiPlotType_Lines);
      local_90 = uVar14;
      fVar24 = (*local_100)(local_128,
                            (int)((long)((ulong)(uint)((int)local_120 >> 0x1f) << 0x20 |
                                        local_120 & 0xffffffff) % (long)values_count));
      pIVar8 = GImGui;
      pIVar1 = (GImGui->Style).Colors + (ulong)(plot_type != ImGuiPlotType_Lines) * 2 + 0x25;
      local_f8.x = pIVar1->x;
      local_f8.y = pIVar1->y;
      uVar4 = pIVar1->z;
      uVar5 = pIVar1->w;
      fVar18 = (GImGui->Style).Alpha;
      local_148._0_4_ = fVar18;
      local_f8.w = (float)uVar5 * fVar18;
      local_f8.z = (float)uVar4;
      local_114 = ColorConvertFloat4ToU32(&local_f8);
      uVar14 = local_120;
      pIVar1 = (pIVar8->Style).Colors + (ulong)(plot_type != ImGuiPlotType_Lines) * 2 + 0x26;
      local_f8.x = pIVar1->x;
      local_f8.y = pIVar1->y;
      uVar6 = pIVar1->z;
      uVar7 = pIVar1->w;
      local_f8.w = (float)local_148._0_4_ * (float)uVar7;
      local_f8.z = (float)uVar6;
      IVar11 = ColorConvertFloat4ToU32(&local_f8);
      if (0 < iVar12) {
        local_58 = (ulong)(uint)(1.0 / (float)iVar12);
        uStack_50 = 0;
        local_b8 = local_b8 - local_a8;
        fVar24 = (fVar24 - local_a8) / local_b8;
        fVar18 = 1.0;
        if (fVar24 <= 1.0) {
          fVar18 = fVar24;
        }
        local_bc = (float)(int)local_138._0_4_;
        local_120 = CONCAT44(local_120._4_4_,local_e8.Min.x);
        local_c4 = local_e8.Max.x - local_e8.Min.x;
        local_c8 = local_e8.Max.y - local_e8.Min.y;
        local_68 = ZEXT416((uint)(local_e8.Min.y + local_c8));
        local_c0 = local_e8.Min.y;
        fVar25 = 0.0;
        uVar21 = 0;
        uVar22 = 0;
        uVar23 = 0;
        fVar18 = (float)(-(uint)(fVar24 < 0.0) & 0x3f800000 |
                        ~-(uint)(fVar24 < 0.0) & (uint)(1.0 - fVar18));
        do {
          iVar15 = (int)(fVar25 * local_bc + 0.5);
          if ((iVar15 < 0) || (values_count <= iVar15)) {
            __assert_fail("v1_idx >= 0 && v1_idx < values_count",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                          ,0x1bc9,
                          "void ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                         );
          }
          local_138._4_4_ = local_58._4_4_;
          local_138._0_4_ = (float)local_58 + fVar25;
          local_138._8_4_ = (undefined4)uStack_50;
          local_138._12_4_ = uStack_50._4_4_;
          local_148._4_4_ = uVar21;
          local_148._0_4_ = fVar25;
          uStack_140 = uVar22;
          uStack_13c = uVar23;
          fVar24 = (*local_100)(pvVar17,((int)uVar14 + 1 + iVar15) % values_count);
          fVar25 = (fVar24 - local_a8) / local_b8;
          fVar24 = 1.0;
          if (fVar25 <= 1.0) {
            fVar24 = fVar25;
          }
          fVar24 = (float)(-(uint)(fVar25 < 0.0) & 0x3f800000 |
                          ~-(uint)(fVar25 < 0.0) & (uint)(1.0 - fVar24));
          fVar25 = (float)local_148._0_4_ * local_c4 + (float)local_120;
          local_f8.y = fVar18 * local_c8 + local_c0;
          local_f8.x = fVar25;
          fVar18 = local_c4 * (float)local_138._0_4_ + (float)local_120;
          if (plot_type == ImGuiPlotType_Lines) {
            local_150.y = local_c8 * fVar24 + local_c0;
            local_150.x = fVar18;
            IVar16 = local_114;
            if ((int)local_90 == iVar15) {
              IVar16 = IVar11;
            }
            ImDrawList::AddLine(local_d8->DrawList,(ImVec2 *)&local_f8,&local_150,IVar16,1.0);
          }
          else {
            local_150.y = (float)local_68._0_4_;
            local_150.x = fVar18;
            if (plot_type == ImGuiPlotType_Histogram) {
              if (fVar25 + 2.0 <= fVar18) {
                local_150.x = fVar18 + -1.0;
              }
              IVar16 = local_114;
              if ((int)local_90 == iVar15) {
                IVar16 = IVar11;
              }
              if (0xffffff < IVar16) {
                this = local_d8->DrawList;
                ImDrawList::PrimReserve(this,6,4);
                pvVar17 = local_128;
                ImDrawList::PrimRect(this,(ImVec2 *)&local_f8,&local_150,IVar16);
              }
            }
          }
          iVar12 = iVar12 + -1;
          fVar25 = (float)local_138._0_4_;
          uVar21 = local_138._4_4_;
          uVar22 = local_138._8_4_;
          uVar23 = local_138._12_4_;
          fVar18 = fVar24;
        } while (iVar12 != 0);
      }
      pIVar8 = local_78;
      if (overlay_text != (char *)0x0) {
        local_f8.y = local_cc + (local_78->Style).FramePadding.y;
        local_f8.x = local_110.x;
        local_150.x = 0.5;
        local_150.y = 0.0;
        RenderTextClipped((ImVec2 *)&local_f8,&local_108,overlay_text,(char *)0x0,(ImVec2 *)0x0,
                          &local_150,(ImRect *)0x0);
      }
      if (0.0 < local_88) {
        IVar20.x = local_108.x + (pIVar8->Style).ItemInnerSpacing.x;
        IVar20.y = local_e8.Min.y;
        RenderText(IVar20,local_70,(char *)0x0,true);
      }
    }
  }
  return;
}

Assistant:

void ImGui::PlotEx(ImGuiPlotType plot_type, const char* label, float (*values_getter)(void* data, int idx), void* data, int values_count, int values_offset, const char* overlay_text, float scale_min, float scale_max, ImVec2 graph_size)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (graph_size.x == 0.0f)
        graph_size.x = CalcItemWidth();
    if (graph_size.y == 0.0f)
        graph_size.y = label_size.y + (style.FramePadding.y * 2);

    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(graph_size.x, graph_size.y));
    const ImRect inner_bb(frame_bb.Min + style.FramePadding, frame_bb.Max - style.FramePadding);
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, NULL))
        return;

    // Determine scale from values if not specified
    if (scale_min == FLT_MAX || scale_max == FLT_MAX)
    {
        float v_min = FLT_MAX;
        float v_max = -FLT_MAX;
        for (int i = 0; i < values_count; i++)
        {
            const float v = values_getter(data, i);
            v_min = ImMin(v_min, v);
            v_max = ImMax(v_max, v);
        }
        if (scale_min == FLT_MAX)
            scale_min = v_min;
        if (scale_max == FLT_MAX)
            scale_max = v_max;
    }

    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    int res_w = ImMin((int)graph_size.x, values_count) + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);
    int item_count = values_count + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);

    // Tooltip on hover
    int v_hovered = -1;
    if (IsHovered(inner_bb, 0))
    {
        const float t = ImClamp((g.IO.MousePos.x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x), 0.0f, 0.9999f);
        const int v_idx = (int)(t * item_count);
        IM_ASSERT(v_idx >= 0 && v_idx < values_count);

        const float v0 = values_getter(data, (v_idx + values_offset) % values_count);
        const float v1 = values_getter(data, (v_idx + 1 + values_offset) % values_count);
        if (plot_type == ImGuiPlotType_Lines)
            SetTooltip("%d: %8.4g\n%d: %8.4g", v_idx, v0, v_idx+1, v1);
        else if (plot_type == ImGuiPlotType_Histogram)
            SetTooltip("%d: %8.4g", v_idx, v0);
        v_hovered = v_idx;
    }

    const float t_step = 1.0f / (float)res_w;

    float v0 = values_getter(data, (0 + values_offset) % values_count);
    float t0 = 0.0f;
    ImVec2 tp0 = ImVec2( t0, 1.0f - ImSaturate((v0 - scale_min) / (scale_max - scale_min)) );    // Point in the normalized space of our target rectangle

    const ImU32 col_base = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLines : ImGuiCol_PlotHistogram);
    const ImU32 col_hovered = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLinesHovered : ImGuiCol_PlotHistogramHovered);

    for (int n = 0; n < res_w; n++)
    {
        const float t1 = t0 + t_step;
        const int v1_idx = (int)(t0 * item_count + 0.5f);
        IM_ASSERT(v1_idx >= 0 && v1_idx < values_count);
        const float v1 = values_getter(data, (v1_idx + values_offset + 1) % values_count);
        const ImVec2 tp1 = ImVec2( t1, 1.0f - ImSaturate((v1 - scale_min) / (scale_max - scale_min)) );

        // NB: Draw calls are merged together by the DrawList system. Still, we should render our batch are lower level to save a bit of CPU.
        ImVec2 pos0 = ImLerp(inner_bb.Min, inner_bb.Max, tp0);
        ImVec2 pos1 = ImLerp(inner_bb.Min, inner_bb.Max, (plot_type == ImGuiPlotType_Lines) ? tp1 : ImVec2(tp1.x, 1.0f));
        if (plot_type == ImGuiPlotType_Lines)
        {
            window->DrawList->AddLine(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
        }
        else if (plot_type == ImGuiPlotType_Histogram)
        {
            if (pos1.x >= pos0.x + 2.0f)
                pos1.x -= 1.0f;
            window->DrawList->AddRectFilled(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
        }

        t0 = t1;
        tp0 = tp1;
    }

    // Text overlay
    if (overlay_text)
        RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, overlay_text, NULL, NULL, ImVec2(0.5f,0.0f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, inner_bb.Min.y), label);
}